

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::end_pass(gd *g)

{
  vw *all;
  options_i *poVar1;
  bool bVar2;
  typed_option<double> *ptVar3;
  shared_data *psVar4;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  all = g->all;
  if (all->save_resume == true) {
    psVar4 = all->sd;
    if ((psVar4->gravity != 0.0) || (NAN(psVar4->gravity))) {
      poVar1 = all->options;
      std::__cxx11::string::string((string *)&local_98,"l1_state",&local_99);
      std::__cxx11::to_string(&local_78,all->sd->gravity);
      (*poVar1->_vptr_options_i[6])(poVar1,&local_98,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      poVar1 = g->all->options;
      std::__cxx11::string::string((string *)&local_98,"l1_state",(allocator *)&local_78);
      ptVar3 = VW::config::options_i::get_typed_option<double>(poVar1,&local_98);
      VW::config::typed_option<double>::value(ptVar3,all->sd->gravity);
      std::__cxx11::string::~string((string *)&local_98);
      psVar4 = all->sd;
    }
    if ((psVar4->contraction != 1.0) || (NAN(psVar4->contraction))) {
      poVar1 = g->all->options;
      std::__cxx11::string::string((string *)&local_98,"l2_state",&local_99);
      std::__cxx11::to_string(&local_78,all->sd->contraction);
      (*poVar1->_vptr_options_i[6])(poVar1,&local_98,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      poVar1 = g->all->options;
      std::__cxx11::string::string((string *)&local_98,"l2_state",(allocator *)&local_78);
      ptVar3 = VW::config::options_i::get_typed_option<double>(poVar1,&local_98);
      VW::config::typed_option<double>::value(ptVar3,all->sd->contraction);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  else {
    sync_weights(all);
  }
  if (all->all_reduce != (AllReduce *)0x0) {
    if (all->adaptive == true) {
      accumulate_weighted_avg(all,&all->weights);
    }
    else {
      accumulate_avg(all,&all->weights,0);
    }
  }
  all->eta = all->eta_decay_rate * all->eta;
  if (all->save_per_pass == true) {
    std::__cxx11::string::string((string *)&local_38,(string *)&all->final_regressor_name);
    save_predictor(all,&local_38,all->current_pass);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (all->holdout_set_off == false) {
    bVar2 = summarize_holdout_set(all,&g->no_win_counter);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_58,(string *)&all->final_regressor_name);
      finalize_regressor(all,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    if ((g->early_stop_thres == g->no_win_counter) &&
       ((all->check_holdout_every_n_passes < 2 ||
        (all->current_pass % all->check_holdout_every_n_passes == 0)))) {
      set_done(all);
    }
  }
  return;
}

Assistant:

void end_pass(gd& g)
{
  vw& all = *g.all;
  if (all.save_resume)
  {
    // TODO work out a better system to update state that will be saved in the model.
    if (all.sd->gravity != 0.)
    {
      g.all->options->replace("l1_state", std::to_string(all.sd->gravity));
      g.all->options->get_typed_option<double>("l1_state").value(all.sd->gravity);
    }
    if (all.sd->contraction != 1.)
    {
      g.all->options->replace("l2_state", std::to_string(all.sd->contraction));
      g.all->options->get_typed_option<double>("l2_state").value(all.sd->contraction);
    }
  }
  else
    sync_weights(all);
  if (all.all_reduce != nullptr)
  {
    if (all.adaptive)
      accumulate_weighted_avg(all, all.weights);
    else
      accumulate_avg(all, all.weights, 0);
  }
  all.eta *= all.eta_decay_rate;
  if (all.save_per_pass)
    save_predictor(all, all.final_regressor_name, all.current_pass);

  if (!all.holdout_set_off)
  {
    if (summarize_holdout_set(all, g.no_win_counter))
      finalize_regressor(all, all.final_regressor_name);
    if ((g.early_stop_thres == g.no_win_counter) &&
        ((all.check_holdout_every_n_passes <= 1) || ((all.current_pass % all.check_holdout_every_n_passes) == 0)))
      set_done(all);
  }
}